

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

int __thiscall
ON_Mesh::GetVertexEdges
          (ON_Mesh *this,int vertex_index_count,int *vertex_index,bool bNoDuplicates,
          ON_SimpleArray<ON_2dex> *edges)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int i;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ON_MeshFace *pOVar8;
  ON_MeshTopologyVertex *pOVar9;
  int *piVar10;
  ON_2dex *pOVar11;
  int local_11c;
  int local_f4;
  int *tmp;
  ON_Workspace ws;
  ON_MeshTopologyEdge *e;
  ON_MeshTopologyVertex *v;
  int top_vi;
  int top_ecount;
  int top_vcount;
  int *topv_map;
  ON_MeshFace *f;
  ON_2dex edge_ends;
  int *f_vi;
  int local_60;
  int vi;
  int n;
  int j;
  int fi;
  int ei;
  int fvi;
  int efi;
  int vei;
  int mesh_fcount;
  int mesh_vcount;
  int edges_count0;
  ON_SimpleArray<ON_2dex> *edges_local;
  int *piStack_28;
  bool bNoDuplicates_local;
  int *vertex_index_local;
  int vertex_index_count_local;
  ON_Mesh *this_local;
  
  i = ON_SimpleArray<ON_2dex>::Count(edges);
  iVar4 = ON_SimpleArray<ON_3fPoint>::Count(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>);
  iVar5 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_F);
  if ((((vertex_index_count < 1) || (vertex_index == (int *)0x0)) || (iVar5 < 1)) || (iVar4 < 3)) {
    this_local._4_4_ = 0;
  }
  else {
    pOVar8 = ON_SimpleArray<ON_MeshFace>::Array(&this->m_F);
    bVar3 = TopologyExists(this);
    if (((bVar3) && (iVar6 = ON_SimpleArray<int>::Count(&(this->m_top).m_topv_map), iVar4 == iVar6))
       && (iVar6 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&(this->m_top).m_tope), 0 < iVar6)) {
      piVar10 = ::ON_SimpleArray::operator_cast_to_int_((ON_SimpleArray *)&(this->m_top).m_topv_map)
      ;
      iVar6 = ON_SimpleArray<ON_MeshTopologyVertex>::Count(&(this->m_top).m_topv);
      iVar7 = ON_SimpleArray<ON_MeshTopologyEdge>::Count(&(this->m_top).m_tope);
      for (local_60 = 0; local_60 < vertex_index_count; local_60 = local_60 + 1) {
        iVar1 = vertex_index[local_60];
        if (((-1 < iVar1) && (iVar1 < iVar4)) &&
           ((iVar2 = piVar10[iVar1], -1 < iVar2 && (iVar2 <= iVar6)))) {
          f = (ON_MeshFace *)CONCAT44(f._4_4_,iVar1);
          pOVar9 = ON_SimpleArray<ON_MeshTopologyVertex>::operator[](&(this->m_top).m_topv,iVar2);
          for (fvi = 0; fvi < pOVar9->m_tope_count; fvi = fvi + 1) {
            iVar2 = pOVar9->m_topei[fvi];
            if ((-1 < iVar2) && (iVar2 < iVar7)) {
              ws.m_pMemBlk = (ON_Workspace_MBLK *)
                             ON_SimpleArray<ON_MeshTopologyEdge>::operator[]
                                       (&(this->m_top).m_tope,iVar2);
              for (ei = 0; ei < *(int *)&(ws.m_pMemBlk)->pMem; ei = ei + 1) {
                iVar2 = *(int *)((long)&(ws.m_pMemBlk[1].pNext)->pNext + (long)ei * 4);
                if ((-1 < iVar2) && (iVar2 < iVar5)) {
                  edge_ends = (ON_2dex)(pOVar8 + iVar2);
                  for (fi = 0; fi < 4; fi = fi + 1) {
                    if (*(int *)((long)edge_ends + (long)fi * 4) == iVar1) {
                      iVar2 = *(int *)((long)edge_ends + (long)((fi + 3) % 4) * 4);
                      if (((-1 < iVar2) && (iVar2 < iVar4)) && (iVar1 != iVar2)) {
                        f = (ON_MeshFace *)CONCAT44(iVar1,iVar2);
                        ON_SimpleArray<ON_2dex>::Append(edges,(ON_2dex *)&f);
                      }
                      if ((fi == 2) &&
                         (*(int *)((long)edge_ends + 8) == *(int *)((long)edge_ends + 0xc))) {
                        local_f4 = 0;
                      }
                      else {
                        local_f4 = (fi + 1) % 4;
                      }
                      iVar2 = *(int *)((long)edge_ends + (long)local_f4 * 4);
                      if (((-1 < iVar2) && (iVar2 < iVar4)) && (iVar1 != iVar2)) {
                        f = (ON_MeshFace *)CONCAT44(iVar2,iVar1);
                        ON_SimpleArray<ON_2dex>::Append(edges,(ON_2dex *)&f);
                      }
                      break;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      ON_Workspace::ON_Workspace((ON_Workspace *)&tmp);
      for (f_vi._4_4_ = 1; piStack_28 = vertex_index, f_vi._4_4_ < vertex_index_count;
          f_vi._4_4_ = f_vi._4_4_ + 1) {
        if (vertex_index[f_vi._4_4_] < vertex_index[f_vi._4_4_ + -1]) {
          piStack_28 = ON_Workspace::GetIntMemory((ON_Workspace *)&tmp,(long)vertex_index_count);
          memcpy(piStack_28,vertex_index,(long)vertex_index_count << 2);
          ON_SortIntArray(quick_sort,piStack_28,(long)vertex_index_count);
          break;
        }
      }
      for (n = 0; n < iVar5; n = n + 1) {
        edge_ends = (ON_2dex)(pOVar8 + n);
        for (fi = 0; fi < 4; fi = fi + 1) {
          iVar6 = *(int *)((long)edge_ends + (long)fi * 4);
          piVar10 = ON_BinarySearchIntArray(iVar6,piStack_28,(long)vertex_index_count);
          if (piVar10 != (int *)0x0) {
            iVar7 = *(int *)((long)edge_ends + (long)((fi + 3) % 4) * 4);
            if (((-1 < iVar7) && (iVar7 < iVar4)) && (iVar6 != iVar7)) {
              f = (ON_MeshFace *)CONCAT44(iVar6,iVar7);
              ON_SimpleArray<ON_2dex>::Append(edges,(ON_2dex *)&f);
            }
            if ((fi == 2) && (*(int *)((long)edge_ends + 8) == *(int *)((long)edge_ends + 0xc))) {
              local_11c = 0;
            }
            else {
              local_11c = (fi + 1) % 4;
            }
            iVar7 = *(int *)((long)edge_ends + (long)local_11c * 4);
            if (((-1 < iVar7) && (iVar7 < iVar4)) && (iVar6 != iVar7)) {
              f = (ON_MeshFace *)CONCAT44(iVar7,iVar6);
              ON_SimpleArray<ON_2dex>::Append(edges,(ON_2dex *)&f);
            }
          }
        }
      }
      ON_Workspace::~ON_Workspace((ON_Workspace *)&tmp);
    }
    if ((bNoDuplicates) && (iVar4 = ON_SimpleArray<ON_2dex>::Count(edges), j = i, i < iVar4)) {
      for (; iVar4 = ON_SimpleArray<ON_2dex>::Count(edges), j < iVar4; j = j + 1) {
        pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,j);
        f = *(ON_MeshFace **)pOVar11;
        if (f._4_4_ < (int)f) {
          f = (ON_MeshFace *)CONCAT44((int)f,f._4_4_);
          pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,j);
          *pOVar11 = (ON_2dex)f;
        }
      }
      pOVar11 = ON_SimpleArray<ON_2dex>::Array(edges);
      iVar4 = ON_SimpleArray<ON_2dex>::Count(edges);
      ON_qsort(pOVar11 + i,(long)(iVar4 - i),8,ON_MeshGetVertexEdges_Compare2dex);
      pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,i);
      f = *(ON_MeshFace **)pOVar11;
      vi = i + 1;
      for (j = vi; iVar4 = ON_SimpleArray<ON_2dex>::Count(edges), j < iVar4; j = j + 1) {
        pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,j);
        iVar4 = ON_Compare2dex((ON_2dex *)&f,pOVar11);
        if (iVar4 != 0) {
          pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,j);
          f = *(ON_MeshFace **)pOVar11;
          if (vi != j) {
            pOVar11 = ON_SimpleArray<ON_2dex>::operator[](edges,vi);
            *pOVar11 = (ON_2dex)f;
          }
          vi = vi + 1;
        }
      }
      ON_SimpleArray<ON_2dex>::SetCount(edges,vi);
    }
    iVar4 = ON_SimpleArray<ON_2dex>::Count(edges);
    this_local._4_4_ = iVar4 - i;
  }
  return this_local._4_4_;
}

Assistant:

int ON_Mesh::GetVertexEdges( 
  int vertex_index_count,
  const int* vertex_index, 
  bool bNoDuplicates,
  ON_SimpleArray<ON_2dex>& edges
  ) const
{
  // Get edges connected to vertices in vertex_index[] array.
  const int edges_count0 = edges.Count();

  const int mesh_vcount = m_V.Count();

  //03/12/2007 TimH. The line below appears to be a typo.  Using the following line works better.
  //const int mesh_fcount = m_V.Count();
  const int mesh_fcount = m_F.Count();

  if (   vertex_index_count <= 0 || 0 == vertex_index 
      || mesh_fcount <= 0 || mesh_vcount < 3 )
  {
    return 0;
  }

  int vei, efi, fvi, ei, fi, j, n, vi;
  const int* f_vi;
  ON_2dex edge_ends;
  const ON_MeshFace* f = m_F.Array();

  if (   TopologyExists()
       && mesh_vcount == m_top.m_topv_map.Count()
       && m_top.m_tope.Count() > 0 )
  {
    // Topology looks good; use it to speed up the search.
    const int* topv_map = m_top.m_topv_map;
    const int top_vcount = m_top.m_topv.Count();
    const int top_ecount = m_top.m_tope.Count();
    int top_vi;
    for ( n = 0; n < vertex_index_count; n++ )
    {
      vi = vertex_index[n];
      if ( vi < 0 || vi >= mesh_vcount )
        continue;
      top_vi = topv_map[vi];
      if ( top_vi < 0 || top_vi > top_vcount )
        continue;
      edge_ends.i = vi;
      const ON_MeshTopologyVertex& v = m_top.m_topv[top_vi];
      for ( vei = 0; vei < v.m_tope_count; vei++ )
      {
        ei = v.m_topei[vei];
        if ( ei < 0 || ei >= top_ecount )
          continue;
        const ON_MeshTopologyEdge& e = m_top.m_tope[ei];
        for ( efi = 0; efi < e.m_topf_count; efi++ )
        {
          fi = e.m_topfi[efi];
          if ( fi < 0 || fi >= mesh_fcount )
            continue;
          f_vi = f[fi].vi;
          for ( fvi = 0; fvi < 4; fvi++ )
          {
            if ( f_vi[fvi] == vi )
            {
              j = f_vi[(fvi+3)%4];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = j;
                edge_ends.j = vi;
                edges.Append(edge_ends);
              }
              j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
              if ( j >= 0 && j < mesh_vcount && vi != j )
              {
                edge_ends.i = vi;
                edge_ends.j = j;
                edges.Append(edge_ends);
              }
              break; // done with this face
            }
          }
        }
      }
    }
  }
  else
  {
    // slow-n-stupid search through all the faces

    // Sort vertex_index[] array so we can use a quick
    // binary search to see if a face is using one of 
    // the vertices in the list.
    ON_Workspace ws;
    for ( vi = 1; vi < vertex_index_count; vi++ )
    {
      if ( vertex_index[vi] < vertex_index[vi-1] )
      {
        // need to sort vertex_index[] array
        int* tmp = ws.GetIntMemory(vertex_index_count);
        memcpy(tmp,vertex_index,vertex_index_count*sizeof(tmp[0]));
        ON_SortIntArray(ON::sort_algorithm::quick_sort,tmp,vertex_index_count);
        vertex_index = tmp;
        break;
      }
    }

    // Find all the faces that use a vertex in the vertex_index[] array.
    for ( fi = 0; fi < mesh_fcount; fi++ )
    {
      f_vi = f[fi].vi;
      for ( fvi = 0; fvi < 4; fvi++ )
      {
        vi = f_vi[fvi];
        if ( ON_BinarySearchIntArray(vi,vertex_index,vertex_index_count) )
        {
          // vi is in the vertex_index[] array.  Add the edges
          // of this face that begin and end at this vertex.
          j = f_vi[(fvi+3)%4];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = j;
            edge_ends.j = vi;
            edges.Append(edge_ends);
          }
          j = f_vi[ (2==fvi && f_vi[2]==f_vi[3]) ? 0 : ((fvi+1)%4) ];
          if ( j >= 0 && j < mesh_vcount && vi != j )
          {
            edge_ends.i = vi;
            edge_ends.j = j;
            edges.Append(edge_ends);
          }
        }
      }
    }
  }

  if ( bNoDuplicates && edges.Count() > edges_count0 )
  {
    for ( ei = edges_count0; ei < edges.Count(); ei++ )
    {
      edge_ends = edges[ei];
      if ( edge_ends.i > edge_ends.j )
      {
        j = edge_ends.i; edge_ends.i = edge_ends.j; edge_ends.j = j;
        edges[ei] = edge_ends;
      }
    }
    ON_qsort( edges.Array() + edges_count0,
              edges.Count() - edges_count0,
              sizeof(edge_ends), 
              ON_MeshGetVertexEdges_Compare2dex);
    edge_ends = edges[edges_count0];
    for ( ei = j = edges_count0+1; ei < edges.Count(); ei++ )
    {
      if ( ON_Compare2dex(&edge_ends,&edges[ei]) )
      {
        edge_ends = edges[ei];
        if ( j != ei )
          edges[j] = edge_ends;
        j++;
      }
    }
    edges.SetCount(j);
  }

  return (edges.Count() - edges_count0);
}